

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonIterativeFeaturePreservingMeshFiltering.cpp
# Opt level: O2

void __thiscall
NonIterativeFeaturePreservingMeshFiltering::getVertexFaceNeighbor
          (NonIterativeFeaturePreservingMeshFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *face_centroid,VertexHandle vh,double r,
          vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *vertex_face_neighbor)

{
  _Bit_pointer *__return_storage_ptr__;
  _Map_pointer *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  pointer pFVar4;
  pointer pVVar5;
  value_type vVar6;
  Point *pPVar7;
  size_type sVar8;
  int i;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  reference rVar13;
  undefined1 local_110 [8];
  queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
  queue_face_handle;
  vector<bool,_std::allocator<bool>_> mark;
  FaceHandle fh;
  undefined1 auStack_58 [8];
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  BaseHandle local_34 [2];
  FaceHandle temp_fh;
  
  face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)r;
  pPVar7 = OpenMesh::
           AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
           point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  *)mesh,(VertexHandle)vh.super_BaseHandle.idx_);
  dVar1 = (pPVar7->super_VectorDataT<double,_3>).values_[0];
  dVar2 = (pPVar7->super_VectorDataT<double,_3>).values_[1];
  dVar3 = (pPVar7->super_VectorDataT<double,_3>).values_[2];
  sVar8 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))(mesh);
  local_110[0] = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             &queue_face_handle.c.
              super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node,sVar8,(bool *)local_110,
             (allocator_type *)auStack_58);
  pFVar4 = (vertex_face_neighbor->
           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vertex_face_neighbor->
      super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
      super__Vector_impl_data._M_finish != pFVar4) {
    (vertex_face_neighbor->
    super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
    super__Vector_impl_data._M_finish = pFVar4;
  }
  std::
  queue<OpenMesh::FaceHandle,std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>>
  ::queue<std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>,void>
            ((queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
              *)local_110);
  OpenMesh::PolyConnectivity::vf_iter
            ((VertexFaceIter *)auStack_58,(PolyConnectivity *)mesh,
             (VertexHandle)vh.super_BaseHandle.idx_);
  face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((double)face_neighbor.
                         super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage +
                (double)face_neighbor.
                        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __return_storage_ptr__ =
       &mark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage;
  while ((face_neighbor.
          super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ != -1 &&
         (((int)face_neighbor.
                super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                _M_impl.super__Vector_impl_data._M_start !=
           face_neighbor.
           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
           super__Vector_impl_data._M_start._4_4_ ||
          ((int)face_neighbor.
                super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish == 0))))) {
    vVar6 = OpenMesh::Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
            ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                         *)auStack_58);
    pVVar5 = (face_centroid->
             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    dVar10 = dVar1 - pVVar5[(int)vVar6.super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_
                     [0];
    dVar11 = dVar2 - pVVar5[(int)vVar6.super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_
                     [1];
    dVar12 = dVar3 - pVVar5[(int)vVar6.super_BaseHandle.idx_].super_VectorDataT<double,_3>.values_
                     [2];
    if (SQRT(dVar12 * dVar12 + dVar10 * dVar10 + dVar11 * dVar11) <=
        (double)face_neighbor.
                super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
      mark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)OpenMesh::Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                             *)auStack_58);
      std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
      emplace_back<OpenMesh::FaceHandle>
                ((deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_110,
                 (FaceHandle *)__return_storage_ptr__);
    }
    vVar6 = OpenMesh::Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
            ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                         *)auStack_58);
    rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        &queue_face_handle.c.
                         super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node,
                        (long)(int)vVar6.super_BaseHandle.idx_);
    *rVar13._M_p = *rVar13._M_p | rVar13._M_mask;
    OpenMesh::Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
    ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                  *)__return_storage_ptr__,
                 (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                  *)auStack_58,0);
  }
  auStack_58 = (undefined1  [8])0x0;
  face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  while (queue_face_handle.c.
         super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
         super__Deque_impl_data._M_start._M_node !=
         (_Map_pointer)
         queue_face_handle.c.
         super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
         super__Deque_impl_data._M_map_size) {
    mark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage._0_4_ =
         *(int *)queue_face_handle.c.
                 super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                 _M_impl.super__Deque_impl_data._M_map_size;
    std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::push_back
              (vertex_face_neighbor,
               (value_type *)
               &mark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage);
    std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::pop_front
              ((deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_110);
    MeshDenoisingBase::getFaceNeighbor
              (&this->super_MeshDenoisingBase,mesh,
               (FaceHandle)
               mark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage._0_4_,kVertexBased,
               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_58);
    for (lVar9 = 0;
        lVar9 < (int)((ulong)((long)face_neighbor.
                                    super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58) >>
                     2); lVar9 = lVar9 + 1) {
      local_34[0].idx_ =
           *(int *)((long)&(((ArrayKernel *)auStack_58)->super_BaseKernel)._vptr_BaseKernel +
                   lVar9 * 4);
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)this_00,(long)local_34[0].idx_);
      if ((*rVar13._M_p & rVar13._M_mask) == 0) {
        sVar8 = (size_type)local_34[0].idx_;
        pVVar5 = (face_centroid->
                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        dVar10 = dVar1 - pVVar5[sVar8].super_VectorDataT<double,_3>.values_[0];
        dVar11 = dVar2 - pVVar5[sVar8].super_VectorDataT<double,_3>.values_[1];
        dVar12 = dVar3 - pVVar5[sVar8].super_VectorDataT<double,_3>.values_[2];
        if (SQRT(dVar12 * dVar12 + dVar10 * dVar10 + dVar11 * dVar11) <=
            (double)face_neighbor.
                    super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::push_back
                    ((deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_110
                     ,(value_type *)local_34);
          sVar8 = (size_type)local_34[0].idx_;
        }
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)this_00,sVar8);
        *rVar13._M_p = *rVar13._M_p | rVar13._M_mask;
      }
    }
  }
  std::_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~_Vector_base
            ((_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_58
            );
  std::_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~_Deque_base
            ((_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_110);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)
             &queue_face_handle.c.
              super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node);
  return;
}

Assistant:

void NonIterativeFeaturePreservingMeshFiltering::getVertexFaceNeighbor(TriMesh &mesh, std::vector<TriMesh::Point> &face_centroid, TriMesh::VertexHandle vh, double r,
                                                                       std::vector<TriMesh::FaceHandle> &vertex_face_neighbor)
{
    double radius = 2.0 * r;
    TriMesh::Point point = mesh.point(vh);

    std::vector<bool> mark(mesh.n_faces(), false);
    vertex_face_neighbor.clear();
    std::queue<TriMesh::FaceHandle> queue_face_handle;
    for(TriMesh::VertexFaceIter vf_it = mesh.vf_iter(vh); vf_it.is_valid(); vf_it++)
    {
        TriMesh::Point centroid = face_centroid[(*vf_it).idx()];
        double length = (point - centroid).length();
        if( length <= radius )
            queue_face_handle.push(*vf_it);
        mark[(*vf_it).idx()] = true;
    }

    std::vector<TriMesh::FaceHandle> face_neighbor;

    while(!queue_face_handle.empty())
    {
        TriMesh::FaceHandle fh = queue_face_handle.front();
        vertex_face_neighbor.push_back(fh);
        queue_face_handle.pop();
        getFaceNeighbor(mesh, fh, kVertexBased, face_neighbor);
        for(int i = 0; i < (int)face_neighbor.size(); i++)
        {
            TriMesh::FaceHandle temp_fh = face_neighbor[i];
            if(mark[temp_fh.idx()] == false)
            {
                TriMesh::Point centroid = face_centroid[temp_fh.idx()];
                double length = (point - centroid).length();
                if(length <= radius)
                    queue_face_handle.push(temp_fh);
                mark[temp_fh.idx()] = true;
            }
        }
    }
}